

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdLocal.c
# Opt level: O2

DdNode * Extra_bddNodePointedByCube(DdManager *dd,DdNode *bF,DdNode *bC)

{
  int iVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  bool bVar8;
  
  pDVar4 = (DdNode *)((ulong)dd->one ^ 1);
  while( true ) {
    if (bC == pDVar4) {
      __assert_fail("bC != b0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/dsd/dsdLocal.c"
                    ,0xcd,"DdNode *Extra_bddNodePointedByCube(DdManager *, DdNode *, DdNode *)");
    }
    if (dd->one == bC) {
      return bF;
    }
    pDVar5 = (DdNode *)((ulong)bF & 0xfffffffffffffffe);
    if ((ulong)pDVar5->index == 0x7fffffff) {
      __assert_fail("!cuddIsConstant( bFR )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/dsd/dsdLocal.c"
                    ,0xdb,"DdNode *Extra_bddNodePointedByCube(DdManager *, DdNode *, DdNode *)");
    }
    pDVar7 = (DdNode *)((ulong)bC & 0xfffffffffffffffe);
    iVar1 = dd->perm[pDVar5->index];
    iVar2 = dd->perm[pDVar7->index];
    pDVar6 = bF;
    if (iVar1 <= iVar2) {
      pDVar3 = (pDVar5->type).kids.E;
      if (bF == pDVar5) {
        pDVar6 = (pDVar5->type).kids.T;
        bF = pDVar3;
      }
      else {
        pDVar6 = (DdNode *)((ulong)(pDVar5->type).kids.T ^ 1);
        bF = (DdNode *)((ulong)pDVar3 ^ 1);
      }
    }
    pDVar5 = bC;
    if (iVar2 <= iVar1) {
      bVar8 = bC == pDVar7;
      bC = (pDVar7->type).kids.E;
      if (bVar8) {
        pDVar5 = (pDVar7->type).kids.T;
      }
      else {
        bC = (DdNode *)((ulong)bC ^ 1);
        pDVar5 = (DdNode *)((ulong)(pDVar7->type).kids.T ^ 1);
      }
    }
    if ((bC != pDVar4) && (pDVar5 != pDVar4)) break;
    if (bC == pDVar4) {
      bC = pDVar5;
      bF = pDVar6;
    }
  }
  __assert_fail("bC0 == b0 || bC1 == b0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/dsd/dsdLocal.c"
                ,0x104,"DdNode *Extra_bddNodePointedByCube(DdManager *, DdNode *, DdNode *)");
}

Assistant:

DdNode * Extra_bddNodePointedByCube( DdManager * dd, DdNode * bF, DdNode * bC )
{
    DdNode * bFR, * bCR;
    DdNode * bF0, * bF1;
    DdNode * bC0, * bC1;
    int LevelF, LevelC;

    assert( bC != b0 );
    if ( bC == b1 )
        return bF;

//    bRes = cuddCacheLookup2( dd, Extra_bddNodePointedByCube, bF, bC );
//    if ( bRes )
//      return bRes;
    // there is no need for caching because this operation is very fast
    // there will no gain reusing the results of this operations
    // instead, it will flush CUDD cache of other useful entries


    bFR = Cudd_Regular( bF ); 
    bCR = Cudd_Regular( bC ); 
    assert( !cuddIsConstant( bFR ) );

    LevelF = dd->perm[bFR->index];
    LevelC = dd->perm[bCR->index];

    if ( LevelF <= LevelC )
    {
        if ( bFR != bF )
        {
            bF0 = Cudd_Not( cuddE(bFR) );
            bF1 = Cudd_Not( cuddT(bFR) );
        }
        else
        {
            bF0 = cuddE(bFR);
            bF1 = cuddT(bFR);
        }
    }
    else
    {
        bF0 = bF1 = bF;
    }

    if ( LevelC <= LevelF )
    {
        if ( bCR != bC )
        {
            bC0 = Cudd_Not( cuddE(bCR) );
            bC1 = Cudd_Not( cuddT(bCR) );
        }
        else
        {
            bC0 = cuddE(bCR);
            bC1 = cuddT(bCR);
        }
    }
    else
    {
        bC0 = bC1 = bC;
    }

    assert( bC0 == b0 || bC1 == b0 );
    if ( bC0 == b0 )
        return Extra_bddNodePointedByCube( dd, bF1, bC1 );
    return Extra_bddNodePointedByCube( dd, bF0, bC0 );
}